

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberAnd_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int32_t iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint local_a4;
  uint local_9c;
  uint local_8c;
  uint local_7c;
  int local_6c;
  int32_t j;
  int32_t i;
  uint8_t b;
  uint8_t a;
  int32_t msudigs;
  uint8_t *msuc;
  uint8_t *uc;
  uint8_t *msub;
  uint8_t *msua;
  uint8_t *ub;
  uint8_t *ua;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  if (((((lhs->exponent == 0) && ((lhs->bits & 0x70) == 0)) && ((lhs->bits & 0x80) == 0)) &&
      ((rhs->exponent == 0 && ((rhs->bits & 0x70) == 0)))) && ((rhs->bits & 0x80) == 0)) {
    ub = lhs->lsu;
    msua = rhs->lsu;
    msuc = res->lsu;
    if (lhs->digits < 0x32) {
      local_7c = (uint)""[lhs->digits];
    }
    else {
      local_7c = lhs->digits / 1;
    }
    puVar5 = ub + (long)(int)local_7c + -1;
    if (rhs->digits < 0x32) {
      local_8c = (uint)""[rhs->digits];
    }
    else {
      local_8c = rhs->digits / 1;
    }
    puVar6 = msua + (long)(int)local_8c + -1;
    if (set->digits < 0x32) {
      local_9c = (uint)""[set->digits];
    }
    else {
      local_9c = set->digits / 1;
    }
    puVar7 = msuc + (long)(int)local_9c + -1;
    iVar1 = set->digits;
    if (set->digits < 0x32) {
      local_a4 = (uint)""[set->digits];
    }
    else {
      local_a4 = set->digits / 1;
    }
    for (; msuc <= puVar7; msuc = msuc + 1) {
      if (puVar5 < ub) {
        j._3_1_ = 0;
      }
      else {
        j._3_1_ = *ub;
      }
      if (puVar6 < msua) {
        j._2_1_ = 0;
      }
      else {
        j._2_1_ = *msua;
      }
      *msuc = '\0';
      if (j._3_1_ != 0 || j._2_1_ != 0) {
        *msuc = '\0';
        for (local_6c = 0; local_6c < 1; local_6c = local_6c + 1) {
          if ((j._3_1_ & j._2_1_ & 1) != 0) {
            *msuc = *msuc + (char)DECPOWERS[local_6c];
          }
          uVar2 = (uint)j._3_1_;
          j._3_1_ = j._3_1_ / 10;
          uVar3 = (uint)j._2_1_;
          j._2_1_ = j._2_1_ / 10;
          if (1 < (uVar3 % 10 | uVar2 % 10)) {
            decStatus(res,0x80,set);
            return res;
          }
          if ((msuc == puVar7) && (local_6c == (iVar1 - (local_a4 - 1)) + -1)) break;
        }
      }
      ub = ub + 1;
      msua = msua + 1;
    }
    iVar4 = decGetDigits(res->lsu,(int)msuc - ((int)res + 9));
    res->digits = iVar4;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
    decStatus(res,0x80,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAnd(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  const Unit *ua, *ub;                  /* -> operands  */
  const Unit *msua, *msub;              /* -> operand msus  */
  Unit *uc,  *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (lhs->exponent!=0 || decNumberIsSpecial(lhs) || decNumberIsNegative(lhs)
   || rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }

  /* operands are valid  */
  ua=lhs->lsu;                          /* bottom-up  */
  ub=rhs->lsu;                          /* ..  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(lhs->digits)-1;           /* -> msu of lhs  */
  msub=ub+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, ub++, uc++) {  /* Unit loop  */
    Unit a, b;                          /* extract units  */
    if (ua>msua) a=0;
     else a=*ua;
    if (ub>msub) b=0;
     else b=*ub;
    *uc=0;                              /* can now write back  */
    if (a|b) {                          /* maybe 1 bits to examine  */
      Int i, j;
      *uc=0;                            /* can now write back  */
      /* This loop could be unrolled and/or use BIN2BCD tables  */
      for (i=0; i<DECDPUN; i++) {
        if (a&b&1) *uc=*uc+(Unit)powers[i];  /* effect AND  */
        j=a%10;
        a=a/10;
        j|=b%10;
        b=b/10;
        if (j>1) {
          decStatus(res, DEC_Invalid_operation, set);
          return res;
          }
        if (uc==msuc && i==msudigs-1) break; /* just did final digit  */
        } /* each digit  */
      } /* both OK  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }